

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_disk.c
# Opt level: O1

void test_read_disk(void)

{
  wchar_t wVar1;
  int iVar2;
  archive *_a;
  char *pcVar3;
  int *piVar4;
  long lVar5;
  int umagic;
  int gmagic;
  int local_38;
  int local_34;
  
  local_34 = 0x13579;
  local_38 = 0x1234;
  _a = archive_read_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                   ,L'U',(uint)(_a != (archive *)0x0),"(a = archive_read_disk_new()) != NULL",
                   (void *)0x0);
  pcVar3 = archive_read_disk_gname(_a,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                   ,L'X',(uint)(pcVar3 == (char *)0x0),"archive_read_disk_gname(a, 0) == NULL",
                   (void *)0x0);
  pcVar3 = archive_read_disk_uname(_a,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                   ,L'Y',(uint)(pcVar3 == (char *)0x0),"archive_read_disk_uname(a, 0) == NULL",
                   (void *)0x0);
  wVar1 = archive_read_disk_set_gname_lookup(_a,&local_34,gname_lookup,gname_cleanup);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                      ,L']',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_read_disk_set_gname_lookup(a, &gmagic, &gname_lookup, &gname_cleanup)"
                      ,(void *)0x0);
  pcVar3 = archive_read_disk_gname(_a,0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
             ,L'_',pcVar3,"archive_read_disk_gname(a, 0)","NOTFOOGROUP","\"NOTFOOGROUP\"",
             (void *)0x0,L'\0');
  pcVar3 = archive_read_disk_gname(_a,1);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
             ,L'`',pcVar3,"archive_read_disk_gname(a, 1)","FOOGROUP","\"FOOGROUP\"",(void *)0x0,
             L'\0');
  wVar1 = archive_read_disk_set_gname_lookup
                    (_a,(void *)0x0,(_func_char_ptr_void_ptr_la_int64_t *)0x0,
                     (_func_void_void_ptr *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                      ,L'd',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_read_disk_set_gname_lookup(a, NULL, NULL, NULL)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                      ,L'f',(long)local_34,"gmagic",0x2468,"0x2468",(void *)0x0);
  wVar1 = archive_read_disk_set_uname_lookup(_a,&local_38,uname_lookup,uname_cleanup);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                      ,L'j',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_read_disk_set_uname_lookup(a, &umagic, &uname_lookup, &uname_cleanup)"
                      ,(void *)0x0);
  pcVar3 = archive_read_disk_uname(_a,0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
             ,L'k',pcVar3,"archive_read_disk_uname(a, 0)","NOTFOO","\"NOTFOO\"",(void *)0x0,L'\0');
  pcVar3 = archive_read_disk_uname(_a,1);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
             ,L'l',pcVar3,"archive_read_disk_uname(a, 1)","FOO","\"FOO\"",(void *)0x0,L'\0');
  wVar1 = archive_read_disk_set_uname_lookup
                    (_a,(void *)0x0,(_func_char_ptr_void_ptr_la_int64_t *)0x0,
                     (_func_void_void_ptr *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                      ,L'n',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_read_disk_set_uname_lookup(a, NULL, NULL, NULL)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                      ,L'o',(long)local_38,"umagic",0x2345,"0x2345",(void *)0x0);
  iVar2 = archive_read_disk_set_standard_lookup(_a);
  if (iVar2 == 0) {
    pcVar3 = archive_read_disk_uname(_a,0);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
               ,L'~',pcVar3,"archive_read_disk_uname(a, 0)","root","\"root\"",(void *)0x0,L'\0');
    pcVar3 = archive_read_disk_gname(_a,0);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                     ,L'\x82',(uint)(pcVar3 != (char *)0x0),"p != NULL",(void *)0x0);
    if (pcVar3 != (char *)0x0) {
      lVar5 = 0;
      piVar4 = &zero_groups_rel;
      do {
        iVar2 = strcmp((char *)((long)&zero_groups_rel + (long)*piVar4),pcVar3);
        if (iVar2 == 0) goto LAB_0014c258;
        lVar5 = lVar5 + 1;
        piVar4 = piVar4 + 1;
      } while (lVar5 == 1);
      lVar5 = 2;
LAB_0014c258:
      if (lVar5 == 2) {
        failure("group 0 didn\'t have any of the expected names");
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                   ,L'\x92',pcVar3,"p","root","zero_groups[0]",(void *)0x0,L'\0');
      }
    }
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                   ,L's');
    test_skipping("standard uname/gname lookup");
  }
  wVar1 = archive_read_disk_set_gname_lookup
                    (_a,(void *)0x0,(_func_char_ptr_void_ptr_la_int64_t *)0x0,
                     (_func_void_void_ptr *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                      ,L'\x9a',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_read_disk_set_gname_lookup(a, NULL, NULL, NULL)",(void *)0x0);
  wVar1 = archive_read_disk_set_uname_lookup
                    (_a,(void *)0x0,(_func_char_ptr_void_ptr_la_int64_t *)0x0,
                     (_func_void_void_ptr *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                      ,L'\x9c',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_read_disk_set_uname_lookup(a, NULL, NULL, NULL)",(void *)0x0);
  pcVar3 = archive_read_disk_gname(_a,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                   ,L'\x9d',(uint)(pcVar3 == (char *)0x0),"archive_read_disk_gname(a, 0) == NULL",
                   (void *)0x0);
  pcVar3 = archive_read_disk_uname(_a,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                   ,L'\x9e',(uint)(pcVar3 == (char *)0x0),"archive_read_disk_uname(a, 0) == NULL",
                   (void *)0x0);
  local_34 = 0x13579;
  local_38 = 0x1234;
  wVar1 = archive_read_disk_set_gname_lookup(_a,&local_34,gname_lookup,gname_cleanup);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                      ,L'¤',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_read_disk_set_gname_lookup(a, &gmagic, &gname_lookup, &gname_cleanup)"
                      ,(void *)0x0);
  wVar1 = archive_read_disk_set_uname_lookup(_a,&local_38,uname_lookup,uname_cleanup);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                      ,L'¦',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_read_disk_set_uname_lookup(a, &umagic, &uname_lookup, &uname_cleanup)"
                      ,(void *)0x0);
  iVar2 = archive_read_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                      ,L'©',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                      ,L'¬',(long)local_34,"gmagic",0x2468,"0x2468",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk.c"
                      ,L'­',(long)local_38,"umagic",0x2345,"0x2345",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_disk)
{
	struct archive *a;
	int gmagic = 0x13579, umagic = 0x1234;
#if !defined(__CYGWIN__) && !defined(__HAIKU__)
	const char *p;
	size_t i;
#endif

	assert((a = archive_read_disk_new()) != NULL);

	/* Default uname/gname lookups always return NULL. */
	assert(archive_read_disk_gname(a, 0) == NULL);
	assert(archive_read_disk_uname(a, 0) == NULL);

	/* Register some weird lookup functions. */
	assertEqualInt(ARCHIVE_OK, archive_read_disk_set_gname_lookup(a,
			   &gmagic, &gname_lookup, &gname_cleanup));
	/* Verify that our new function got called. */
	assertEqualString(archive_read_disk_gname(a, 0), "NOTFOOGROUP");
	assertEqualString(archive_read_disk_gname(a, 1), "FOOGROUP");

	/* De-register. */
	assertEqualInt(ARCHIVE_OK,
	    archive_read_disk_set_gname_lookup(a, NULL, NULL, NULL));
	/* Ensure our cleanup function got called. */
	assertEqualInt(gmagic, 0x2468);

	/* Same thing with uname lookup.... */
	assertEqualInt(ARCHIVE_OK, archive_read_disk_set_uname_lookup(a,
			   &umagic, &uname_lookup, &uname_cleanup));
	assertEqualString(archive_read_disk_uname(a, 0), "NOTFOO");
	assertEqualString(archive_read_disk_uname(a, 1), "FOO");
	assertEqualInt(ARCHIVE_OK,
	    archive_read_disk_set_uname_lookup(a, NULL, NULL, NULL));
	assertEqualInt(umagic, 0x2345);

	/* Try the standard lookup functions. */
	if (archive_read_disk_set_standard_lookup(a) != ARCHIVE_OK) {
		skipping("standard uname/gname lookup");
	} else {
#if defined(__CYGWIN__) || defined(__HAIKU__)
		/* Some platforms don't have predictable names for
		 * uid=0, so we skip this part of the test. */
		skipping("standard uname/gname lookup");
#else
		/* XXX Someday, we may need to generalize this the
		 * same way we generalized the group name check below.
		 * That's needed only if we encounter a system where
		 * uid 0 is not "root". XXX */
		assertEqualString(archive_read_disk_uname(a, 0), "root");

		/* Get the group name for group 0 and see if it makes sense. */
		p = archive_read_disk_gname(a, 0);
		assert(p != NULL);
		if (p != NULL) {
			i = 0;
			while (i < sizeof(zero_groups)/sizeof(zero_groups[0])) {
				if (strcmp(zero_groups[i], p) == 0)
					break;
				++i;
			}
			if (i == sizeof(zero_groups)/sizeof(zero_groups[0])) {
				/* If you get a failure here, either
				 * archive_read_disk_gname() isn't working or
				 * your system uses a different name for group
				 * number zero.  If the latter, please add a
				 * new entry to the zero_groups[] array above.
				 */
				failure("group 0 didn't have any of the expected names");
				assertEqualString(p, zero_groups[0]);
			}
		}
#endif
	}

	/* Deregister again and verify the default lookups again. */
	assertEqualInt(ARCHIVE_OK,
	    archive_read_disk_set_gname_lookup(a, NULL, NULL, NULL));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_disk_set_uname_lookup(a, NULL, NULL, NULL));
	assert(archive_read_disk_gname(a, 0) == NULL);
	assert(archive_read_disk_uname(a, 0) == NULL);

	/* Re-register our custom handlers. */
	gmagic = 0x13579;
	umagic = 0x1234;
	assertEqualInt(ARCHIVE_OK, archive_read_disk_set_gname_lookup(a,
			   &gmagic, &gname_lookup, &gname_cleanup));
	assertEqualInt(ARCHIVE_OK, archive_read_disk_set_uname_lookup(a,
			   &umagic, &uname_lookup, &uname_cleanup));

	/* Destroy the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/* Verify our cleanup functions got called. */
	assertEqualInt(gmagic, 0x2468);
	assertEqualInt(umagic, 0x2345);
}